

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

Message * __thiscall
google::protobuf::Reflection::UnsafeArenaReleaseLast
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  int number;
  Reflection *pRVar3;
  Descriptor *actual;
  Descriptor *pDVar4;
  ExtensionSet *this_00;
  MapFieldBase *this_01;
  RepeatedPtrFieldBase *pRVar5;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  pRVar3 = Message::GetReflection(message);
  if (this != pRVar3) {
    pDVar4 = this->descriptor_;
    actual = Message::GetDescriptor(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar4,actual,field,"UnsafeArenaReleaseLast");
  }
  pDVar4 = FieldDescriptor::containing_type(field);
  if (pDVar4 != this->descriptor_) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"UnsafeArenaReleaseLast","Field does not match message type."
              );
  }
  bVar1 = FieldDescriptor::is_repeated(field);
  if (!bVar1) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"UnsafeArenaReleaseLast",
               "Field is singular; the method requires a repeated field.");
  }
  CVar2 = FieldDescriptor::cpp_type(field);
  if (CVar2 != CPPTYPE_MESSAGE) {
    anon_unknown_6::ReportReflectionUsageTypeError
              (this->descriptor_,field,"UnsafeArenaReleaseLast",CPPTYPE_MESSAGE);
  }
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = MutableExtensionSet(this,message);
    number = FieldDescriptor::number(field);
    this_local = (Reflection *)internal::ExtensionSet::UnsafeArenaReleaseLast(this_00,number);
  }
  else {
    bVar1 = anon_unknown_6::IsMapFieldInApi(field);
    if (bVar1) {
      this_01 = MutableRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
      pRVar5 = internal::MapFieldBase::MutableRepeatedField(this_01);
      this_local = (Reflection *)
                   internal::RepeatedPtrFieldBase::
                   UnsafeArenaReleaseLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                             (pRVar5);
    }
    else {
      pRVar5 = MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
      this_local = (Reflection *)
                   internal::RepeatedPtrFieldBase::
                   UnsafeArenaReleaseLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                             (pRVar5);
    }
  }
  return (Message *)this_local;
}

Assistant:

Message* Reflection::UnsafeArenaReleaseLast(
    Message* message, const FieldDescriptor* field) const {
  USAGE_MUTABLE_CHECK_ALL(UnsafeArenaReleaseLast, REPEATED, MESSAGE);

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->UnsafeArenaReleaseLast(field->number()));
  } else {
    if (IsMapFieldInApi(field)) {
      return MutableRaw<MapFieldBase>(message, field)
          ->MutableRepeatedField()
          ->UnsafeArenaReleaseLast<GenericTypeHandler<Message>>();
    } else {
      return MutableRaw<RepeatedPtrFieldBase>(message, field)
          ->UnsafeArenaReleaseLast<GenericTypeHandler<Message>>();
    }
  }
}